

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpWithTcpClient::handleTcpMessage
          (KcpWithTcpClient *this,TcpConnectionPtr *tcpConn,string *message,Timestamp param_3)

{
  EventLoop *loop;
  InetAddress addr;
  uint16_t port;
  unsigned_short uVar1;
  uint32_t id;
  int32_t secretId_00;
  uint32_t uVar2;
  sz_sock fd;
  long lVar3;
  LogStream *this_00;
  self *this_01;
  unsigned_long v;
  void *data;
  size_t len;
  undefined8 uVar4;
  element_type *this_02;
  KcpConnection *this_03;
  element_type *peVar5;
  SourceFile file;
  KcpWithTcpClient *local_1218;
  code *local_1210;
  undefined8 local_1208;
  type local_1200;
  KcpCloseCallback local_11e8;
  undefined8 uStack_11c8;
  undefined4 uStack_11c0;
  undefined4 local_11bc;
  undefined4 uStack_11b8;
  undefined8 uStack_11b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a8 [8];
  string connName;
  InetAddress local_1188;
  char local_1168 [8];
  char buf [256];
  int secretId;
  uint32_t conv;
  uint16_t udpListenPort;
  Buffer recvBuf;
  undefined1 local_1008 [12];
  Logger local_ff8;
  string *local_28;
  string *message_local;
  TcpConnectionPtr *tcpConn_local;
  KcpWithTcpClient *this_local;
  Timestamp param_3_local;
  
  local_28 = message;
  message_local = (string *)tcpConn;
  tcpConn_local = (TcpConnectionPtr *)this;
  this_local = (KcpWithTcpClient *)param_3.m_microSecondsSinceEpoch;
  EventLoop::assertInLoopThread(this->m_loop);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 10) {
    Buffer::Buffer((Buffer *)&conv,4,0x400);
    data = (void *)std::__cxx11::string::data();
    len = std::__cxx11::string::size();
    Buffer::append((Buffer *)&conv,data,len);
    port = Buffer::readInt16((Buffer *)&conv);
    id = Buffer::readInt32((Buffer *)&conv);
    secretId_00 = Buffer::readInt32((Buffer *)&conv);
    InetAddress::resetPort(&this->m_udpListenAddr,port,false);
    InetAddress::toIpPort_abi_cxx11_(&local_1188);
    uVar4 = std::__cxx11::string::c_str();
    this_02 = std::
              __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)message_local);
    uVar2 = TcpConnection::id(this_02);
    snprintf(local_1168,0x100,":kcp-%s#%d",uVar4,(ulong)uVar2);
    std::__cxx11::string::~string((string *)&local_1188);
    std::operator+(local_11a8,(char *)&this->m_name);
    this_03 = (KcpConnection *)operator_new(0x1f0);
    loop = this->m_loop;
    uVar1 = InetAddress::family(&this->m_udpListenAddr);
    fd = sockets::sz_udp_create((uint)uVar1);
    KcpConnection::KcpConnection(this_03,loop,fd,secretId_00,local_11a8,id,true,this->m_kcpMode);
    std::__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::
    reset<sznet::net::KcpConnection>
              (&(this->m_kcpConnection).
                super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>,this_03);
    peVar5 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_kcpConnection);
    KcpConnection::setState(peVar5,kConnecting);
    peVar5 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_kcpConnection);
    uStack_11c8 = *(undefined8 *)&(this->m_udpListenAddr).field_0;
    uVar4 = *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 8);
    uStack_11b4 = *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0x14);
    uStack_11b8 = (undefined4)
                  ((ulong)*(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0xc) >> 0x20);
    uStack_11c0 = (undefined4)uVar4;
    local_11bc = (undefined4)((ulong)uVar4 >> 0x20);
    addr.field_0._12_4_ = local_11bc;
    addr.field_0._0_12_ = *(undefined1 (*) [12])&(this->m_udpListenAddr).field_0;
    addr.field_0._16_4_ = uStack_11b8;
    addr.field_0._20_8_ = uStack_11b4;
    KcpConnection::setPeerAddr(peVar5,addr);
    peVar5 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_kcpConnection);
    KcpConnection::newKCP(peVar5);
    peVar5 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_kcpConnection);
    KcpConnection::setKcpConnectionCallback(peVar5,&this->m_kcpConnectionCallback);
    peVar5 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_kcpConnection);
    KcpConnection::setKcpMessageCallback(peVar5,&this->m_kcpMessageCallback);
    peVar5 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_kcpConnection);
    KcpConnection::setKcpWriteCompleteCallback(peVar5,&this->m_kcpWriteCompleteCallback);
    peVar5 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_kcpConnection);
    local_1210 = removeKcpConnection;
    local_1208 = 0;
    local_1218 = this;
    std::
    bind<void(sznet::net::KcpWithTcpClient::*)(std::shared_ptr<sznet::net::KcpConnection>const&),sznet::net::KcpWithTcpClient*,std::_Placeholder<1>const&>
              (&local_1200,(offset_in_KcpWithTcpClient_to_subr *)&local_1210,&local_1218,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>::
    function<std::_Bind<void(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient*,std::_Placeholder<1>))(std::shared_ptr<sznet::net::KcpConnection>const&)>,void>
              ((function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)> *)&local_11e8,
               &local_1200);
    KcpConnection::setKcpCloseCallback(peVar5,&local_11e8);
    std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>::~function
              (&local_11e8);
    peVar5 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_kcpConnection);
    KcpConnection::udpSendHandShakeVerify(peVar5);
    peVar5 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_kcpConnection);
    KcpConnection::udpSendHandShakeTimer(peVar5);
    std::__cxx11::string::~string((string *)local_11a8);
    Buffer::~Buffer((Buffer *)&conv);
  }
  else {
    Logger::SourceFile::SourceFile<107>
              ((SourceFile *)local_1008,
               (char (*) [107])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1008._0_8_;
    file.m_size = local_1008._8_4_;
    Logger::Logger(&local_ff8,file,0xd4,ERROR);
    this_00 = Logger::stream(&local_ff8);
    this_01 = LogStream::operator<<(this_00,"KcpWithTcpClient::handleTcpMessage recv size error - ")
    ;
    v = std::__cxx11::string::size();
    LogStream::operator<<(this_01,v);
    Logger::~Logger(&local_ff8);
  }
  return;
}

Assistant:

void KcpWithTcpClient::handleTcpMessage(const TcpConnectionPtr& tcpConn, const string& message, Timestamp)
{
	m_loop->assertInLoopThread();
	if (message.size() != (sizeof(uint16_t) + sizeof(int32_t) + sizeof(int32_t)))
	{
		LOG_ERROR << "KcpWithTcpClient::handleTcpMessage recv size error - " << message.size();
		return;
	}
	Buffer recvBuf;
	recvBuf.append(reinterpret_cast<const void*>(message.data()), message.size());
	// ����������Ϣ
	uint16_t udpListenPort = static_cast<uint16_t>(recvBuf.readInt16());
	uint32_t conv = static_cast<uint32_t>(recvBuf.readInt32());
	int secretId = recvBuf.readInt32();
	m_udpListenAddr.resetPort(udpListenPort);
	// ����KcpConnection
	char buf[256];
	snprintf(buf, sizeof(buf), ":kcp-%s#%d", m_udpListenAddr.toIpPort().c_str(), tcpConn->id());
	string connName = m_name + buf;
	m_kcpConnection.reset(new KcpConnection(m_loop, sockets::sz_udp_create(m_udpListenAddr.family()), secretId, connName, conv, true, m_kcpMode));
	m_kcpConnection->setState(KcpConnection::StateE::kConnecting);
	m_kcpConnection->setPeerAddr(m_udpListenAddr);
	m_kcpConnection->newKCP();
	m_kcpConnection->setKcpConnectionCallback(m_kcpConnectionCallback);
	m_kcpConnection->setKcpMessageCallback(m_kcpMessageCallback);
	m_kcpConnection->setKcpWriteCompleteCallback(m_kcpWriteCompleteCallback);
	m_kcpConnection->setKcpCloseCallback(std::bind(&KcpWithTcpClient::removeKcpConnection, this, std::placeholders::_1));
	m_kcpConnection->udpSendHandShakeVerify();
	m_kcpConnection->udpSendHandShakeTimer();
}